

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O1

matd_t * matd_plu_l(matd_plu_t *mlu)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  matd_t *pmVar4;
  matd_t *pmVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  pmVar4 = mlu->lu;
  pmVar5 = matd_create(pmVar4->nrows,pmVar4->ncols);
  uVar1 = pmVar4->nrows;
  if ((ulong)uVar1 != 0) {
    uVar2 = pmVar5->ncols;
    iVar6 = 0;
    uVar7 = 0;
    do {
      pmVar5[(ulong)((uVar2 + 1) * (int)uVar7) + 1].nrows = 0;
      pmVar5[(ulong)((uVar2 + 1) * (int)uVar7) + 1].ncols = 0x3ff00000;
      if (uVar7 != 0) {
        uVar3 = pmVar4->ncols;
        uVar8 = 0;
        do {
          pmVar5[(ulong)(uint)(iVar6 + (int)uVar8) + 1] =
               pmVar4[(ulong)(uVar3 * (int)uVar7 + (int)uVar8) + 1];
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
      uVar7 = uVar7 + 1;
      iVar6 = iVar6 + uVar2;
    } while (uVar7 != uVar1);
  }
  return pmVar5;
}

Assistant:

matd_t *matd_plu_l(const matd_plu_t *mlu)
{
    matd_t *lu = mlu->lu;

    matd_t *L = matd_create(lu->nrows, lu->ncols);
    for (int i = 0; i < lu->nrows; i++) {
        MATD_EL(L, i, i) = 1;

        for (int j = 0; j < i; j++) {
            MATD_EL(L, i, j) = MATD_EL(lu, i, j);
        }
    }

    return L;
}